

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O1

void __thiscall aeron::BufferBuilder::BufferBuilder(BufferBuilder *this,uint32_t initialLength)

{
  uchar *puVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  this->_vptr_BufferBuilder = (_func_int **)&PTR__BufferBuilder_00164250;
  uVar3 = initialLength - 1;
  uVar2 = 1;
  do {
    uVar3 = uVar3 >> ((byte)uVar2 & 0x1f) | uVar3;
    bVar4 = uVar2 < 0x10;
    uVar2 = uVar2 * 2;
  } while (bVar4);
  this->m_capacity = uVar3 + 1;
  this->m_limit = 0x20;
  puVar1 = (uchar *)operator_new__((ulong)(uVar3 + 1));
  (this->m_buffer)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar1;
  return;
}

Assistant:

BufferBuilder(std::uint32_t initialLength) :
        m_capacity(BitUtil::findNextPowerOfTwo(initialLength)),
        m_limit(static_cast<std::uint32_t>(DataFrameHeader::LENGTH)),
        m_buffer(new std::uint8_t[m_capacity])
    {
    }